

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  XMLGrammarPoolImpl *this;
  long lVar2;
  ThreadParser *this_00;
  ThreadInfo *pTVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  char *pcVar8;
  int *piVar9;
  long lVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar25;
  undefined1 auVar23 [16];
  int iVar26;
  undefined1 auVar24 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar48;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar49;
  undefined1 auVar47 [16];
  int iVar50;
  int iVar55;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 in_XMM13 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  
  parseCommandLine(argc,argv);
  uVar5 = 0;
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  if (((gRunInfo.doSchema == true) && (gRunInfo.doNamespaces == true)) &&
     (gRunInfo.doGrammarCaching == true)) {
    gpMemMgr = (MemoryManager *)operator_new(8);
    gpMemMgr->_vptr_MemoryManager =
         (_func_int **)&xercesc_4_0::XMLUni::fgXercesHandleMultipleImports;
    this = (XMLGrammarPoolImpl *)xercesc_4_0::XMemory::operator_new((XMemory *)0x40,uVar5);
    xercesc_4_0::XMLGrammarPoolImpl::XMLGrammarPoolImpl(this,gpMemMgr);
    gRunInfo.doInitialParse = true;
    gp = (XMLGrammarPool *)this;
  }
  ReadFilesIntoMemory();
  auVar1 = _DAT_001070a0;
  if (0 < (long)gRunInfo.numInputFiles) {
    uVar4 = gRunInfo.numInputFiles + 3;
    lVar2 = (long)gRunInfo.numInputFiles + -1;
    auVar12._8_4_ = (int)lVar2;
    auVar12._0_8_ = lVar2;
    auVar12._12_4_ = (int)((ulong)lVar2 >> 0x20);
    lVar2 = 0;
    auVar12 = auVar12 ^ _DAT_001070a0;
    auVar23 = _DAT_00107080;
    auVar27 = _DAT_00107090;
    do {
      auVar19 = auVar27 ^ auVar1;
      iVar48 = auVar12._4_4_;
      if ((bool)(~(auVar19._4_4_ == iVar48 && auVar12._0_4_ < auVar19._0_4_ ||
                  iVar48 < auVar19._4_4_) & 1)) {
        *(undefined4 *)((long)&gRunInfo.files[0].checkSum + lVar2) = 0;
      }
      if ((auVar19._12_4_ != auVar12._12_4_ || auVar19._8_4_ <= auVar12._8_4_) &&
          auVar19._12_4_ <= auVar12._12_4_) {
        *(undefined4 *)((long)&gRunInfo.files[1].checkSum + lVar2) = 0;
      }
      auVar19 = auVar23 ^ auVar1;
      iVar49 = auVar19._4_4_;
      if (iVar49 <= iVar48 && (iVar49 != iVar48 || auVar19._0_4_ <= auVar12._0_4_)) {
        *(undefined4 *)((long)&gRunInfo.files[2].checkSum + lVar2) = 0;
        *(undefined4 *)((long)&gRunInfo.files[3].checkSum + lVar2) = 0;
      }
      lVar10 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + 4;
      auVar27._8_8_ = lVar10 + 4;
      lVar10 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + 4;
      auVar23._8_8_ = lVar10 + 4;
      lVar2 = lVar2 + 0xa0;
    } while ((ulong)(uVar4 >> 2) * 0xa0 != lVar2);
  }
  if (gRunInfo.doInitialParse == true) {
    this_00 = (ThreadParser *)operator_new(0x40);
    ThreadParser::ThreadParser(this_00);
    if (gRunInfo.numInputFiles < 1) {
      ThreadParser::~ThreadParser(this_00);
      operator_delete(this_00,0x40);
    }
    else {
      piVar9 = &gRunInfo.files[0].checkSum;
      bVar6 = false;
      lVar2 = 0;
      do {
        pcVar8 = ((InFileInfo *)(piVar9 + -8))->fileName;
        if (gRunInfo.verbose == true) {
          printf("%s checksum is ",pcVar8);
        }
        uVar4 = ThreadParser::parse(this_00,(int)lVar2);
        if (uVar4 == 0) {
          fprintf(_stderr,"An error occurred while initially parsing %s\n",pcVar8);
          bVar6 = true;
        }
        *piVar9 = uVar4;
        if (gRunInfo.verbose == true) {
          printf("%x\n",(ulong)uVar4);
        }
        if (((gRunInfo.dumpOnErr == true) && (bVar6)) && (gRunInfo.dom == true)) {
          ThreadParser::domPrint(this_00);
        }
        lVar2 = lVar2 + 1;
        piVar9 = piVar9 + 10;
      } while (lVar2 < gRunInfo.numInputFiles);
      ThreadParser::~ThreadParser(this_00);
      operator_delete(this_00,0x40);
      if (bVar6) {
        main_cold_1();
        return 1;
      }
    }
  }
  iVar48 = gRunInfo.numThreads;
  uVar5 = (ulong)gRunInfo.numThreads;
  if (uVar5 == 0) {
    clearFileInfoMemory();
    exit(0);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  uVar7 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0xc),8) == 0) {
    uVar7 = SUB168(auVar1 * ZEXT816(0xc),0);
  }
  gThreadInfo = (ThreadInfo *)operator_new__(uVar7);
  pTVar3 = gThreadInfo;
  do {
    pTVar3->fHeartBeat = false;
    pTVar3->fInProgress = false;
    pTVar3->fParses = 0;
    pTVar3->fThreadNum = -1;
    pTVar3 = pTVar3 + 1;
  } while (pTVar3 != gThreadInfo + uVar5);
  if (0 < iVar48) {
    lVar2 = 0;
    lVar10 = 0;
    do {
      pTVar3 = gThreadInfo;
      *(int *)((long)&gThreadInfo->fThreadNum + lVar2) = (int)lVar10;
      ThreadFuncs::startThread(threadMain,&pTVar3->fHeartBeat + lVar2);
      lVar10 = lVar10 + 1;
      lVar2 = lVar2 + 0xc;
    } while (lVar10 < gRunInfo.numThreads);
  }
  if (gRunInfo.numParses == 0) {
    lVar2 = xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
    if (-1 < gRunInfo.totalTime) {
      do {
        sleep(1);
        if (gRunInfo.verbose == false && gRunInfo.quiet == false) {
          if (0 < (long)gRunInfo.numThreads) {
            lVar10 = 0;
            do {
              if ((&gThreadInfo->fHeartBeat)[lVar10] == false) {
                fputc(0x2e,_stdout);
                fflush(_stdout);
                goto LAB_001067a6;
              }
              lVar10 = lVar10 + 0xc;
            } while ((long)gRunInfo.numThreads * 0xc != lVar10);
          }
          fputc(0x2b,_stdout);
          fflush(_stdout);
          pTVar3 = gThreadInfo;
          auVar1 = _DAT_001070a0;
          if (0 < (long)gRunInfo.numThreads) {
            uVar4 = gRunInfo.numThreads + 0xf;
            lVar10 = (long)gRunInfo.numThreads + -1;
            auVar13._8_4_ = (int)lVar10;
            auVar13._0_8_ = lVar10;
            auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
            lVar10 = 0;
            auVar19 = _DAT_00107090;
            auVar15 = _DAT_00107080;
            auVar16 = _DAT_00107110;
            auVar17 = _DAT_00107100;
            auVar18 = _DAT_001070f0;
            auVar20 = _DAT_001070e0;
            auVar21 = _DAT_001070d0;
            auVar22 = _DAT_001070c0;
            do {
              auVar23 = auVar13 ^ auVar1;
              auVar27 = auVar19 ^ auVar1;
              iVar48 = auVar23._0_4_;
              iVar50 = -(uint)(iVar48 < auVar27._0_4_);
              iVar49 = auVar23._4_4_;
              auVar28._4_4_ = -(uint)(iVar49 < auVar27._4_4_);
              iVar25 = auVar23._8_4_;
              iVar55 = -(uint)(iVar25 < auVar27._8_4_);
              iVar26 = auVar23._12_4_;
              auVar28._12_4_ = -(uint)(iVar26 < auVar27._12_4_);
              auVar39._4_4_ = iVar50;
              auVar39._0_4_ = iVar50;
              auVar39._8_4_ = iVar55;
              auVar39._12_4_ = iVar55;
              auVar23 = pshuflw(in_XMM13,auVar39,0xe8);
              auVar41._4_4_ = -(uint)(auVar27._4_4_ == iVar49);
              auVar41._12_4_ = -(uint)(auVar27._12_4_ == iVar26);
              auVar41._0_4_ = auVar41._4_4_;
              auVar41._8_4_ = auVar41._12_4_;
              auVar12 = pshuflw(in_XMM14,auVar41,0xe8);
              auVar28._0_4_ = auVar28._4_4_;
              auVar28._8_4_ = auVar28._12_4_;
              auVar27 = pshuflw(auVar23,auVar28,0xe8);
              auVar56._8_4_ = 0xffffffff;
              auVar56._0_8_ = 0xffffffffffffffff;
              auVar56._12_4_ = 0xffffffff;
              auVar23 = (auVar27 | auVar12 & auVar23) ^ auVar56;
              auVar23 = packssdw(auVar23,auVar23);
              if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                (&pTVar3->fHeartBeat)[lVar10] = false;
              }
              auVar28 = auVar41 & auVar39 | auVar28;
              auVar23 = packssdw(auVar28,auVar28);
              auVar23 = packssdw(auVar23 ^ auVar56,auVar23 ^ auVar56);
              auVar23 = packsswb(auVar23,auVar23);
              if ((auVar23._0_4_ >> 8 & 1) != 0) {
                (&pTVar3[1].fHeartBeat)[lVar10] = false;
              }
              auVar23 = auVar15 ^ auVar1;
              iVar50 = -(uint)(iVar48 < auVar23._0_4_);
              auVar51._4_4_ = -(uint)(iVar49 < auVar23._4_4_);
              iVar55 = -(uint)(iVar25 < auVar23._8_4_);
              auVar51._12_4_ = -(uint)(iVar26 < auVar23._12_4_);
              auVar29._4_4_ = iVar50;
              auVar29._0_4_ = iVar50;
              auVar29._8_4_ = iVar55;
              auVar29._12_4_ = iVar55;
              auVar40._4_4_ = -(uint)(auVar23._4_4_ == iVar49);
              auVar40._12_4_ = -(uint)(auVar23._12_4_ == iVar26);
              auVar40._0_4_ = auVar40._4_4_;
              auVar40._8_4_ = auVar40._12_4_;
              auVar51._0_4_ = auVar51._4_4_;
              auVar51._8_4_ = auVar51._12_4_;
              auVar23 = auVar40 & auVar29 | auVar51;
              auVar23 = packssdw(auVar23,auVar23);
              auVar23 = packssdw(auVar23 ^ auVar56,auVar23 ^ auVar56);
              auVar23 = packsswb(auVar23,auVar23);
              if ((auVar23._0_4_ >> 0x10 & 1) != 0) {
                (&pTVar3[2].fHeartBeat)[lVar10] = false;
              }
              auVar27 = pshufhw(auVar29,auVar29,0x84);
              auVar41 = pshufhw(auVar40,auVar40,0x84);
              auVar12 = pshufhw(auVar27,auVar51,0x84);
              auVar27 = (auVar12 | auVar41 & auVar27) ^ auVar56;
              auVar27 = packssdw(auVar27,auVar27);
              auVar27 = packsswb(auVar27,auVar27);
              if ((auVar27._0_4_ >> 0x18 & 1) != 0) {
                (&pTVar3[3].fHeartBeat)[lVar10] = false;
              }
              auVar27 = auVar16 ^ auVar1;
              iVar50 = -(uint)(iVar48 < auVar27._0_4_);
              auVar31._4_4_ = -(uint)(iVar49 < auVar27._4_4_);
              iVar55 = -(uint)(iVar25 < auVar27._8_4_);
              auVar31._12_4_ = -(uint)(iVar26 < auVar27._12_4_);
              auVar42._4_4_ = iVar50;
              auVar42._0_4_ = iVar50;
              auVar42._8_4_ = iVar55;
              auVar42._12_4_ = iVar55;
              auVar23 = pshuflw(auVar23,auVar42,0xe8);
              auVar30._4_4_ = -(uint)(auVar27._4_4_ == iVar49);
              auVar30._12_4_ = -(uint)(auVar27._12_4_ == iVar26);
              auVar30._0_4_ = auVar30._4_4_;
              auVar30._8_4_ = auVar30._12_4_;
              auVar12 = pshuflw(auVar56,auVar30,0xe8);
              auVar31._0_4_ = auVar31._4_4_;
              auVar31._8_4_ = auVar31._12_4_;
              auVar27 = pshuflw(auVar23,auVar31,0xe8);
              auVar57._8_4_ = 0xffffffff;
              auVar57._0_8_ = 0xffffffffffffffff;
              auVar57._12_4_ = 0xffffffff;
              auVar23 = (auVar27 | auVar12 & auVar23) ^ auVar57;
              auVar23 = packssdw(auVar23,auVar23);
              auVar23 = packsswb(auVar23,auVar23);
              if ((auVar23 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                (&pTVar3[4].fHeartBeat)[lVar10] = false;
              }
              auVar31 = auVar30 & auVar42 | auVar31;
              auVar23 = packssdw(auVar31,auVar31);
              auVar23 = packssdw(auVar23 ^ auVar57,auVar23 ^ auVar57);
              auVar23 = packsswb(auVar23,auVar23);
              if ((auVar23._4_2_ >> 8 & 1) != 0) {
                (&pTVar3[5].fHeartBeat)[lVar10] = false;
              }
              auVar23 = auVar17 ^ auVar1;
              iVar50 = -(uint)(iVar48 < auVar23._0_4_);
              auVar52._4_4_ = -(uint)(iVar49 < auVar23._4_4_);
              iVar55 = -(uint)(iVar25 < auVar23._8_4_);
              auVar52._12_4_ = -(uint)(iVar26 < auVar23._12_4_);
              auVar32._4_4_ = iVar50;
              auVar32._0_4_ = iVar50;
              auVar32._8_4_ = iVar55;
              auVar32._12_4_ = iVar55;
              auVar43._4_4_ = -(uint)(auVar23._4_4_ == iVar49);
              auVar43._12_4_ = -(uint)(auVar23._12_4_ == iVar26);
              auVar43._0_4_ = auVar43._4_4_;
              auVar43._8_4_ = auVar43._12_4_;
              auVar52._0_4_ = auVar52._4_4_;
              auVar52._8_4_ = auVar52._12_4_;
              auVar23 = auVar43 & auVar32 | auVar52;
              auVar23 = packssdw(auVar23,auVar23);
              auVar23 = packssdw(auVar23 ^ auVar57,auVar23 ^ auVar57);
              auVar23 = packsswb(auVar23,auVar23);
              if ((auVar23 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                (&pTVar3[6].fHeartBeat)[lVar10] = false;
              }
              auVar27 = pshufhw(auVar32,auVar32,0x84);
              auVar41 = pshufhw(auVar43,auVar43,0x84);
              auVar12 = pshufhw(auVar27,auVar52,0x84);
              auVar27 = (auVar12 | auVar41 & auVar27) ^ auVar57;
              auVar27 = packssdw(auVar27,auVar27);
              auVar27 = packsswb(auVar27,auVar27);
              if ((auVar27._6_2_ >> 8 & 1) != 0) {
                (&pTVar3[7].fHeartBeat)[lVar10] = false;
              }
              auVar27 = auVar18 ^ auVar1;
              iVar50 = -(uint)(iVar48 < auVar27._0_4_);
              auVar34._4_4_ = -(uint)(iVar49 < auVar27._4_4_);
              iVar55 = -(uint)(iVar25 < auVar27._8_4_);
              auVar34._12_4_ = -(uint)(iVar26 < auVar27._12_4_);
              auVar44._4_4_ = iVar50;
              auVar44._0_4_ = iVar50;
              auVar44._8_4_ = iVar55;
              auVar44._12_4_ = iVar55;
              auVar23 = pshuflw(auVar23,auVar44,0xe8);
              auVar33._4_4_ = -(uint)(auVar27._4_4_ == iVar49);
              auVar33._12_4_ = -(uint)(auVar27._12_4_ == iVar26);
              auVar33._0_4_ = auVar33._4_4_;
              auVar33._8_4_ = auVar33._12_4_;
              auVar12 = pshuflw(auVar57,auVar33,0xe8);
              auVar34._0_4_ = auVar34._4_4_;
              auVar34._8_4_ = auVar34._12_4_;
              auVar27 = pshuflw(auVar23,auVar34,0xe8);
              auVar58._8_4_ = 0xffffffff;
              auVar58._0_8_ = 0xffffffffffffffff;
              auVar58._12_4_ = 0xffffffff;
              auVar23 = (auVar27 | auVar12 & auVar23) ^ auVar58;
              auVar23 = packssdw(auVar23,auVar23);
              auVar23 = packsswb(auVar23,auVar23);
              if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                (&pTVar3[8].fHeartBeat)[lVar10] = false;
              }
              auVar34 = auVar33 & auVar44 | auVar34;
              auVar23 = packssdw(auVar34,auVar34);
              auVar23 = packssdw(auVar23 ^ auVar58,auVar23 ^ auVar58);
              auVar23 = packsswb(auVar23,auVar23);
              if ((auVar23._8_2_ >> 8 & 1) != 0) {
                (&pTVar3[9].fHeartBeat)[lVar10] = false;
              }
              auVar23 = auVar20 ^ auVar1;
              iVar50 = -(uint)(iVar48 < auVar23._0_4_);
              auVar53._4_4_ = -(uint)(iVar49 < auVar23._4_4_);
              iVar55 = -(uint)(iVar25 < auVar23._8_4_);
              auVar53._12_4_ = -(uint)(iVar26 < auVar23._12_4_);
              auVar35._4_4_ = iVar50;
              auVar35._0_4_ = iVar50;
              auVar35._8_4_ = iVar55;
              auVar35._12_4_ = iVar55;
              auVar45._4_4_ = -(uint)(auVar23._4_4_ == iVar49);
              auVar45._12_4_ = -(uint)(auVar23._12_4_ == iVar26);
              auVar45._0_4_ = auVar45._4_4_;
              auVar45._8_4_ = auVar45._12_4_;
              auVar53._0_4_ = auVar53._4_4_;
              auVar53._8_4_ = auVar53._12_4_;
              auVar23 = auVar45 & auVar35 | auVar53;
              auVar23 = packssdw(auVar23,auVar23);
              auVar23 = packssdw(auVar23 ^ auVar58,auVar23 ^ auVar58);
              auVar23 = packsswb(auVar23,auVar23);
              if ((auVar23 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                (&pTVar3[10].fHeartBeat)[lVar10] = false;
              }
              auVar27 = pshufhw(auVar35,auVar35,0x84);
              auVar41 = pshufhw(auVar45,auVar45,0x84);
              auVar12 = pshufhw(auVar27,auVar53,0x84);
              auVar27 = (auVar12 | auVar41 & auVar27) ^ auVar58;
              auVar27 = packssdw(auVar27,auVar27);
              auVar27 = packsswb(auVar27,auVar27);
              if ((auVar27._10_2_ >> 8 & 1) != 0) {
                (&pTVar3[0xb].fHeartBeat)[lVar10] = false;
              }
              auVar27 = auVar21 ^ auVar1;
              iVar50 = -(uint)(iVar48 < auVar27._0_4_);
              auVar37._4_4_ = -(uint)(iVar49 < auVar27._4_4_);
              iVar55 = -(uint)(iVar25 < auVar27._8_4_);
              auVar37._12_4_ = -(uint)(iVar26 < auVar27._12_4_);
              auVar46._4_4_ = iVar50;
              auVar46._0_4_ = iVar50;
              auVar46._8_4_ = iVar55;
              auVar46._12_4_ = iVar55;
              auVar23 = pshuflw(auVar23,auVar46,0xe8);
              auVar36._4_4_ = -(uint)(auVar27._4_4_ == iVar49);
              auVar36._12_4_ = -(uint)(auVar27._12_4_ == iVar26);
              auVar36._0_4_ = auVar36._4_4_;
              auVar36._8_4_ = auVar36._12_4_;
              auVar12 = pshuflw(auVar58,auVar36,0xe8);
              auVar37._0_4_ = auVar37._4_4_;
              auVar37._8_4_ = auVar37._12_4_;
              auVar27 = pshuflw(auVar23,auVar37,0xe8);
              in_XMM14._8_4_ = 0xffffffff;
              in_XMM14._0_8_ = 0xffffffffffffffff;
              in_XMM14._12_4_ = 0xffffffff;
              auVar23 = (auVar27 | auVar12 & auVar23) ^ in_XMM14;
              auVar23 = packssdw(auVar23,auVar23);
              auVar23 = packsswb(auVar23,auVar23);
              if ((auVar23 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                (&pTVar3[0xc].fHeartBeat)[lVar10] = false;
              }
              auVar37 = auVar36 & auVar46 | auVar37;
              auVar23 = packssdw(auVar37,auVar37);
              auVar23 = packssdw(auVar23 ^ in_XMM14,auVar23 ^ in_XMM14);
              auVar23 = packsswb(auVar23,auVar23);
              if ((auVar23._12_2_ >> 8 & 1) != 0) {
                (&pTVar3[0xd].fHeartBeat)[lVar10] = false;
              }
              auVar23 = auVar22 ^ auVar1;
              auVar54._0_4_ = -(uint)(iVar48 < auVar23._0_4_);
              auVar54._4_4_ = -(uint)(iVar49 < auVar23._4_4_);
              auVar54._8_4_ = -(uint)(iVar25 < auVar23._8_4_);
              auVar54._12_4_ = -(uint)(iVar26 < auVar23._12_4_);
              auVar38._4_4_ = auVar54._0_4_;
              auVar38._0_4_ = auVar54._0_4_;
              auVar38._8_4_ = auVar54._8_4_;
              auVar38._12_4_ = auVar54._8_4_;
              iVar48 = -(uint)(auVar23._4_4_ == iVar49);
              iVar49 = -(uint)(auVar23._12_4_ == iVar26);
              auVar24._4_4_ = iVar48;
              auVar24._0_4_ = iVar48;
              auVar24._8_4_ = iVar49;
              auVar24._12_4_ = iVar49;
              auVar47._4_4_ = auVar54._4_4_;
              auVar47._0_4_ = auVar54._4_4_;
              auVar47._8_4_ = auVar54._12_4_;
              auVar47._12_4_ = auVar54._12_4_;
              in_XMM13 = auVar24 & auVar38 | auVar47;
              auVar23 = packssdw(auVar54,in_XMM13);
              auVar23 = packssdw(auVar23 ^ in_XMM14,auVar23 ^ in_XMM14);
              auVar23 = packsswb(auVar23,auVar23);
              if ((auVar23 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                (&pTVar3[0xe].fHeartBeat)[lVar10] = false;
              }
              auVar27 = pshufhw(auVar38,auVar38,0x84);
              auVar23 = pshufhw(auVar24,auVar24,0x84);
              auVar12 = pshufhw(auVar27,auVar47,0x84);
              auVar23 = packssdw(auVar23 & auVar27,(auVar12 | auVar23 & auVar27) ^ in_XMM14);
              auVar23 = packsswb(auVar23,auVar23);
              if ((auVar23._14_2_ >> 8 & 1) != 0) {
                (&pTVar3[0xf].fHeartBeat)[lVar10] = false;
              }
              lVar14 = auVar19._8_8_;
              auVar19._0_8_ = auVar19._0_8_ + 0x10;
              auVar19._8_8_ = lVar14 + 0x10;
              lVar14 = auVar15._8_8_;
              auVar15._0_8_ = auVar15._0_8_ + 0x10;
              auVar15._8_8_ = lVar14 + 0x10;
              lVar14 = auVar16._8_8_;
              auVar16._0_8_ = auVar16._0_8_ + 0x10;
              auVar16._8_8_ = lVar14 + 0x10;
              lVar14 = auVar17._8_8_;
              auVar17._0_8_ = auVar17._0_8_ + 0x10;
              auVar17._8_8_ = lVar14 + 0x10;
              lVar14 = auVar18._8_8_;
              auVar18._0_8_ = auVar18._0_8_ + 0x10;
              auVar18._8_8_ = lVar14 + 0x10;
              lVar14 = auVar20._8_8_;
              auVar20._0_8_ = auVar20._0_8_ + 0x10;
              auVar20._8_8_ = lVar14 + 0x10;
              lVar14 = auVar21._8_8_;
              auVar21._0_8_ = auVar21._0_8_ + 0x10;
              auVar21._8_8_ = lVar14 + 0x10;
              lVar14 = auVar22._8_8_;
              auVar22._0_8_ = auVar22._0_8_ + 0x10;
              auVar22._8_8_ = lVar14 + 0x10;
              lVar10 = lVar10 + 0xc0;
            } while ((ulong)(uVar4 >> 4) * 0xc0 != lVar10);
          }
        }
LAB_001067a6:
        lVar10 = xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
      } while ((gRunInfo.totalTime == 0) ||
              ((int)((ulong)(lVar10 - lVar2) / 1000) < gRunInfo.totalTime));
    }
  }
  else {
    do {
      sleep(1);
      if ((long)gRunInfo.numThreads < 1) {
        gRunInfo.stopNow = true;
        dVar11 = 0.0;
        goto LAB_00106888;
      }
      lVar2 = 0;
      bVar6 = false;
      do {
        if (*(uint *)((long)&gThreadInfo->fParses + lVar2) < gRunInfo.numParses) {
          bVar6 = true;
        }
        lVar2 = lVar2 + 0xc;
      } while ((long)gRunInfo.numThreads * 0xc != lVar2);
    } while (bVar6);
  }
  gRunInfo.stopNow = true;
  dVar11 = 0.0;
  if (0 < gRunInfo.numThreads) {
    uVar5 = 0;
    pTVar3 = gThreadInfo;
    do {
      if (pTVar3[uVar5].fInProgress == true) {
        do {
          sleep(1);
          pTVar3 = gThreadInfo;
        } while (gThreadInfo[uVar5].fInProgress != false);
      }
      if (gRunInfo.verbose == true) {
        printf("Thread #%d: is finished.\n",uVar5 & 0xffffffff);
        pTVar3 = gThreadInfo;
      }
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < (long)gRunInfo.numThreads);
    dVar11 = 0.0;
    if (0 < gRunInfo.numThreads) {
      lVar2 = 0;
      do {
        dVar11 = dVar11 + (double)*(uint *)((long)&gThreadInfo->fParses + lVar2);
        lVar2 = lVar2 + 0xc;
      } while ((long)gRunInfo.numThreads * 0xc != lVar2);
    }
  }
LAB_00106888:
  if (gRunInfo.quiet == false) {
    if (gRunInfo.numParses == 0) {
      dVar11 = dVar11 / ((double)gRunInfo.totalTime / 60.0);
      pcVar8 = "\n%8.2f parses per minute.\n";
    }
    else {
      pcVar8 = "\n%8.0f total parses were completed.\n";
    }
    printf(pcVar8,dVar11);
  }
  if ((gp != (XMLGrammarPool *)0x0) &&
     ((**(code **)(*(long *)gp + 8))(), gpMemMgr != (MemoryManager *)0x0)) {
    (*gpMemMgr->_vptr_MemoryManager[1])();
  }
  xercesc_4_0::XMLPlatformUtils::Terminate();
  clearFileInfoMemory();
  if (gThreadInfo != (ThreadInfo *)0x0) {
    operator_delete__(gThreadInfo);
  }
  puts("Test Run Successfully");
  return 0;
}

Assistant:

int main (int argc, char **argv)
{


    parseCommandLine(argc, argv);

    //
    // Initialize the XML system.
    //
    try
    {
         XMLPlatformUtils::Initialize();
    }
    catch (...)
    {
        fprintf(stderr, "Exception from XMLPlatfromUtils::Initialize.\n");
        return 1;
    }


    /** Grammar caching thread testing */
    // Initialize memory manger and grammar pool
    // set doInitialParse to true so that the first parse will cache the
    // grammar and it'll be used in subsequent parses

    if (gRunInfo.doSchema == true && gRunInfo.doNamespaces == true && gRunInfo.doGrammarCaching == true) {
        gpMemMgr = new MemoryManagerImpl();
        gp = new XMLGrammarPoolImpl(gpMemMgr);
        gRunInfo.doInitialParse = true;
    }

    //
    // If we will be parsing from memory, read each of the input files
    //  into memory now.
    //
    ReadFilesIntoMemory();

    // Initialize checksums to zero so we can check first parse and if
    // zero then we need to move first parse's checksum into array. This
    // is for the cse where we skip the initial parse.
    for (int n = 0; n < gRunInfo.numInputFiles; n++)
    {
        gRunInfo.files[n].checkSum = 0;
    }

    if (gRunInfo.doInitialParse)
    {
    //
    // While we are still single threaded, parse each of the documents
    // once, to check for errors, and to note the checksum.
    // Blow off the rest of the test if there are errors.
    //
        ThreadParser *mainParser = new ThreadParser;
        int     n;
        bool    errors = false;
        int     cksum;

        for (n = 0; n < gRunInfo.numInputFiles; n++)
        {
            char *fileName = gRunInfo.files[n].fileName;
            if (gRunInfo.verbose)
                printf("%s checksum is ", fileName);

            cksum = mainParser->parse(n);

            if (cksum == 0) {
                fprintf(stderr, "An error occurred while initially parsing %s\n",
                    fileName);
                errors = true;
            };

            gRunInfo.files[n].checkSum = cksum;
            if (gRunInfo.verbose )
                printf("%x\n", cksum);
            if (gRunInfo.dumpOnErr && errors && gRunInfo.dom) {
                mainParser->domPrint();
            }

        }
        delete mainParser;

        if (errors) {
            fprintf(stderr, "Quitting due to error incurred during initial parse\n");
            clearFileInfoMemory();
            return 1;
        }
    }

    //
    //  Fire off the requested number of parallel threads
    //

    if (gRunInfo.numThreads == 0) {
        clearFileInfoMemory();
        exit(0);
    }

    gThreadInfo = new ThreadInfo[gRunInfo.numThreads];

    int threadNum;
    for (threadNum=0; threadNum < gRunInfo.numThreads; threadNum++)
    {
        gThreadInfo[threadNum].fThreadNum = threadNum;
        ThreadFuncs::startThread(threadMain, &gThreadInfo[threadNum]);
    }

    if (gRunInfo.numParses)
    {
        bool notDone;
        while (true)
        {
            ThreadFuncs::Sleep(1000);
            notDone = false;

            for (threadNum = 0; threadNum < gRunInfo.numThreads; threadNum++) {
                if (gThreadInfo[threadNum].fParses < gRunInfo.numParses)
                    notDone = true;
            }
            if (notDone == false) {
                break;
            }
        }
    }
    else
    {
        //
        //  Loop, watching the heartbeat of the worker threads.
        //    Each second, display "+" when all threads have completed a parse
        //                 display "." if some thread hasn't since previous "+"
        //

        unsigned long startTime = XMLPlatformUtils::getCurrentMillis();
        int elapsedSeconds = 0;
        while (gRunInfo.totalTime == 0 || gRunInfo.totalTime > elapsedSeconds) {
            ThreadFuncs::Sleep(1000);
            if (gRunInfo.quiet == false && gRunInfo.verbose == false) {
                char c = '+';
                for (threadNum=0; threadNum < gRunInfo.numThreads; threadNum++) {
                    if (gThreadInfo[threadNum].fHeartBeat == false) {
                        c = '.';
                        break;
                    }
                }
                fputc(c, stdout);
                fflush(stdout);
                if (c == '+')
                    for (threadNum=0; threadNum < gRunInfo.numThreads; threadNum++)
                        gThreadInfo[threadNum].fHeartBeat = false;
            }
            elapsedSeconds = (XMLPlatformUtils::getCurrentMillis() - startTime) / 1000;
        }
    }

    //
    //  Time's up, we are done.  (We only get here if this was a timed run)
    //  Tally up the total number of parses completed by each of the threads.
    //
    gRunInfo.stopNow = true;      // set flag, which will cause worker threads to stop.

    //
    //  Make sure all threads are done before terminate
    //
    for (threadNum=0; threadNum < gRunInfo.numThreads; threadNum++) {
        while (gThreadInfo[threadNum].fInProgress == true) {
            ThreadFuncs::Sleep(1000);
        }
        if (gRunInfo.verbose)
            printf("Thread #%d: is finished.\n", threadNum);
    }

    //
    //  We are done!   Count the number of parse and terminate the program
    //
    double totalParsesCompleted = 0;
    for (threadNum=0; threadNum < gRunInfo.numThreads; threadNum++)
    {
        totalParsesCompleted += gThreadInfo[threadNum].fParses;
        // printf("%f   ", totalParsesCompleted);
    }

    if (gRunInfo.quiet == false) {
        if (gRunInfo.numParses) {
            printf("\n%8.0f total parses were completed.\n", totalParsesCompleted);
        }
        else {
            double parsesPerMinute = totalParsesCompleted / (double(gRunInfo.totalTime) / double(60));
            printf("\n%8.2f parses per minute.\n", parsesPerMinute);
        }
    }

    // delete grammar pool and memory manager
    if (gp) {
        delete gp;
        delete gpMemMgr;
    }

    XMLPlatformUtils::Terminate();

    clearFileInfoMemory();

    delete [] gThreadInfo;

    printf("Test Run Successfully\n");

    return 0;
}